

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
::grow(DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
       *this,uint AtLeast)

{
  uint64_t uVar1;
  uint *puVar2;
  uint local_28 [2];
  DenseSetPair<llvm::StringRef> *local_20;
  DenseSetPair<llvm::StringRef> *OldBuckets;
  uint OldNumBuckets;
  uint AtLeast_local;
  DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
  *this_local;
  
  OldBuckets._0_4_ = *(uint *)(this + 0x10);
  local_20 = *(DenseSetPair<llvm::StringRef> **)this;
  local_28[1] = 0x40;
  OldBuckets._4_4_ = AtLeast;
  _OldNumBuckets = this;
  uVar1 = NextPowerOf2((ulong)(AtLeast - 1));
  local_28[0] = (uint)uVar1;
  puVar2 = std::max<unsigned_int>(local_28 + 1,local_28);
  allocateBuckets(this,*puVar2);
  if (*(long *)this != 0) {
    if (local_20 == (DenseSetPair<llvm::StringRef> *)0x0) {
      DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
      ::initEmpty((DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
                   *)this);
    }
    else {
      DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
      ::moveFromOldBuckets
                ((DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
                  *)this,local_20,local_20 + (uint)OldBuckets);
      operator_delete(local_20);
    }
    return;
  }
  __assert_fail("Buckets",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                ,0x2dd,
                "void llvm::DenseMap<llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>::grow(unsigned int) [KeyT = llvm::StringRef, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<StringRef>, BucketT = llvm::detail::DenseSetPair<llvm::StringRef>]"
               );
}

Assistant:

void grow(unsigned AtLeast) {
    unsigned OldNumBuckets = NumBuckets;
    BucketT *OldBuckets = Buckets;

    allocateBuckets(std::max<unsigned>(64, static_cast<unsigned>(NextPowerOf2(AtLeast-1))));
    assert(Buckets);
    if (!OldBuckets) {
      this->BaseT::initEmpty();
      return;
    }

    this->moveFromOldBuckets(OldBuckets, OldBuckets+OldNumBuckets);

    // Free the old table.
    operator delete(OldBuckets);
  }